

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

bool __thiscall dynet::LookupParameter::is_updated(LookupParameter *this)

{
  bool bVar1;
  LookupParameter *in_stack_00000018;
  Model *in_stack_00000020;
  
  bVar1 = Model::is_updated_lookup_param(in_stack_00000020,in_stack_00000018);
  return bVar1;
}

Assistant:

bool LookupParameter::is_updated() {
  return mp->is_updated_lookup_param(this);
}